

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

Stream * __thiscall Log::Stream::operator<<(Stream *this,char *val)

{
  ostream *poVar1;
  allocator<char> local_39;
  string local_38 [32];
  
  poVar1 = this->stream;
  std::__cxx11::string::string<std::allocator<char>>(local_38,val,&local_39);
  std::operator<<(poVar1,local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

Stream & operator << (const char val[]) {
      *stream << std::string(val);
      return *this;
    }